

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_dataset_ensure.h
# Opt level: O1

cellid_t * __thiscall trimesh::dataset_t::max_fct(dataset_t *this,cellid_t c)

{
  pointer piVar1;
  ostream *poVar2;
  runtime_error *this_00;
  stringstream ss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  piVar1 = (this->m_cell_mxfct).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1[c] == invalid_cellid) {
    return piVar1 + c;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Failed to assert condition ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"m_cell_mxfct[c] == invalid_cellid",0x21);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"at (",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,
             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_dataset_ensure.h"
             ,0x6c);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,",",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"max_fct",7);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,",",1);
  poVar2 = (ostream *)std::ostream::operator<<(local_190,0x2e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") \n ",4);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline cellid_t& dataset_t::max_fct(cellid_t c)
  {ASSERT(m_cell_mxfct[c] == invalid_cellid);return m_cell_mxfct[c];}